

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O3

int Cudd_ReduceHeap(DdManager *table,Cudd_ReorderingType heuristic,int minsize)

{
  double dVar1;
  DdHook *pDVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  abctime aVar7;
  
  iVar3 = 1;
  if ((uint)minsize <= table->keys - table->dead) {
    if (heuristic == CUDD_REORDER_SAME) {
      heuristic = table->autoMethod;
    }
    if (heuristic != CUDD_REORDER_NONE) {
      table->reorderings = table->reorderings + 1;
      pvVar6 = (void *)Extra_CpuTime();
      for (pDVar2 = table->preReorderingHook; pDVar2 != (DdHook *)0x0; pDVar2 = pDVar2->next) {
        iVar3 = (*pDVar2->f)(table,"BDD",(void *)heuristic);
        if (iVar3 == 0) goto LAB_0080bae9;
      }
      iVar3 = ddReorderPreprocess(table);
      if (iVar3 != 0) {
        ddTotalNumberSwapping = 0;
        if (table->peakLiveNodes < table->keys) {
          table->peakLiveNodes = table->keys;
        }
        if ((table->reordCycle == 0) || (table->reorderings % table->reordCycle != 0)) {
          iVar3 = cuddTreeSifting(table,heuristic);
        }
        else {
          dVar1 = table->maxGrowth;
          table->maxGrowth = table->maxGrowthAlt;
          iVar3 = cuddTreeSifting(table,heuristic);
          table->maxGrowth = dVar1;
        }
        if (iVar3 != 0) {
          if (table->interact != (long *)0x0) {
            free(table->interact);
            table->interact = (long *)0x0;
          }
          if ((table->realign == 0) || (iVar4 = cuddZddAlignToBdd(table), iVar4 != 0)) {
            uVar5 = (table->constants).keys;
            uVar5 = uVar5 + (table->keys - uVar5) * 2 + 2;
            if ((table->reorderings < 0x14) || (table->nextDyn < uVar5)) {
              table->nextDyn = uVar5;
            }
            else {
              table->nextDyn = table->nextDyn + 0x14;
            }
            table->reordered = 1;
            pDVar2 = table->postReorderingHook;
            while( true ) {
              if (pDVar2 == (DdHook *)0x0) {
                aVar7 = Extra_CpuTime();
                table->reordTime = table->reordTime + (aVar7 - (long)pvVar6);
                return iVar3;
              }
              iVar4 = (*pDVar2->f)(table,"BDD",pvVar6);
              if (iVar4 == 0) break;
              pDVar2 = pDVar2->next;
            }
          }
        }
      }
LAB_0080bae9:
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int
Cudd_ReduceHeap(
  DdManager * table /* DD manager */,
  Cudd_ReorderingType heuristic /* method used for reordering */,
  int  minsize /* bound below which no reordering occurs */)
{
    DdHook *hook;
    int result;
    unsigned int nextDyn;
#ifdef DD_STATS
    unsigned int initialSize;
    unsigned int finalSize;
#endif
    long localTime;

    /* Don't reorder if there are too many dead nodes. */
    if (table->keys - table->dead < (unsigned) minsize)
        return(1);

    if (heuristic == CUDD_REORDER_SAME) {
        heuristic = table->autoMethod;
    }
    if (heuristic == CUDD_REORDER_NONE) {
        return(1);
    }

    /* This call to Cudd_ReduceHeap does initiate reordering. Therefore
    ** we count it.
    */
    table->reorderings++;

    localTime = util_cpu_time();

    /* Run the hook functions. */
    hook = table->preReorderingHook;
    while (hook != NULL) {
        int res = (hook->f)(table, "BDD", (void *)heuristic);
        if (res == 0) return(0);
        hook = hook->next;
    }

    if (!ddReorderPreprocess(table)) return(0);
    ddTotalNumberSwapping = 0;

    if (table->keys > table->peakLiveNodes) {
        table->peakLiveNodes = table->keys;
    }
#ifdef DD_STATS
    initialSize = table->keys - table->isolated;
    ddTotalNISwaps = 0;

    switch(heuristic) {
    case CUDD_REORDER_RANDOM:
    case CUDD_REORDER_RANDOM_PIVOT:
        (void) fprintf(table->out,"#:I_RANDOM  ");
        break;
    case CUDD_REORDER_SIFT:
    case CUDD_REORDER_SIFT_CONVERGE:
    case CUDD_REORDER_SYMM_SIFT:
    case CUDD_REORDER_SYMM_SIFT_CONV:
    case CUDD_REORDER_GROUP_SIFT:
    case CUDD_REORDER_GROUP_SIFT_CONV:
        (void) fprintf(table->out,"#:I_SIFTING ");
        break;
    case CUDD_REORDER_WINDOW2:
    case CUDD_REORDER_WINDOW3:
    case CUDD_REORDER_WINDOW4:
    case CUDD_REORDER_WINDOW2_CONV:
    case CUDD_REORDER_WINDOW3_CONV:
    case CUDD_REORDER_WINDOW4_CONV:
        (void) fprintf(table->out,"#:I_WINDOW  ");
        break;
    case CUDD_REORDER_ANNEALING:
        (void) fprintf(table->out,"#:I_ANNEAL  ");
        break;
    case CUDD_REORDER_GENETIC:
        (void) fprintf(table->out,"#:I_GENETIC ");
        break;
    case CUDD_REORDER_LINEAR:
    case CUDD_REORDER_LINEAR_CONVERGE:
        (void) fprintf(table->out,"#:I_LINSIFT ");
        break;
    case CUDD_REORDER_EXACT:
        (void) fprintf(table->out,"#:I_EXACT   ");
        break;
    default:
        return(0);
    }
    (void) fprintf(table->out,"%8d: initial size",initialSize);
#endif

    /* See if we should use alternate threshold for maximum growth. */
    if (table->reordCycle && table->reorderings % table->reordCycle == 0) {
        double saveGrowth = table->maxGrowth;
        table->maxGrowth = table->maxGrowthAlt;
        result = cuddTreeSifting(table,heuristic);
        table->maxGrowth = saveGrowth;
    } else {
        result = cuddTreeSifting(table,heuristic);
    }

#ifdef DD_STATS
    (void) fprintf(table->out,"\n");
    finalSize = table->keys - table->isolated;
    (void) fprintf(table->out,"#:F_REORDER %8d: final size\n",finalSize);
    (void) fprintf(table->out,"#:T_REORDER %8g: total time (sec)\n",
                   ((double)(util_cpu_time() - localTime)/1000.0));
    (void) fprintf(table->out,"#:N_REORDER %8d: total swaps\n",
                   ddTotalNumberSwapping);
    (void) fprintf(table->out,"#:M_REORDER %8d: NI swaps\n",ddTotalNISwaps);
#endif

    if (result == 0)
        return(0);

    if (!ddReorderPostprocess(table))
        return(0);

    if (table->realign) {
        if (!cuddZddAlignToBdd(table))
            return(0);
    }

    nextDyn = (table->keys - table->constants.keys + 1) *
              DD_DYN_RATIO + table->constants.keys;
    if (table->reorderings < 20 || nextDyn > table->nextDyn)
        table->nextDyn = nextDyn;
    else
        table->nextDyn += 20;
    table->reordered = 1;

    /* Run hook functions. */
    hook = table->postReorderingHook;
    while (hook != NULL) {
        int res = (hook->f)(table, "BDD", (void *)localTime);
        if (res == 0) return(0);
        hook = hook->next;
    }
    /* Update cumulative reordering time. */
    table->reordTime += util_cpu_time() - localTime;

    return(result);

}